

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QGraphicsItem_**>::begin(QList<QGraphicsItem_**> *this)

{
  QGraphicsItem ***n;
  QArrayDataPointer<QGraphicsItem_**> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QGraphicsItem_**> *)0x9a49a9);
  QArrayDataPointer<QGraphicsItem_**>::operator->(in_RDI);
  n = QArrayDataPointer<QGraphicsItem_**>::begin((QArrayDataPointer<QGraphicsItem_**> *)0x9a49ba);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }